

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

tuple<int,_int> __thiscall
Display::getRequiredWindowSize(Display *this,int field_width,int field_height,int mine_count)

{
  int iVar1;
  int iVar2;
  
  iVar2 = field_width * 2 + -1;
  iVar1 = getMaxTextWidth(mine_count);
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  *(int *)&(this->controller).mfield.mines.
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start = field_height + 3;
  *(int *)((long)&(this->controller).mfield.mines.
                  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4) = iVar2 + 1;
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> Display::getRequiredWindowSize(int field_width, int field_height, int mine_count) {
    int required_width = field_width;
    int required_height = field_height;

    std::tie(required_width, required_height) = getConsolePosition(field_width - 1, field_height - 1);

    int max_text_width = getMaxTextWidth(mine_count);

    int text_height;
    text_height = std::get<1>(getConsolePosition(field_width - 1, field_height + 2));

    if (max_text_width > required_width) {
        required_width = max_text_width;
    }

    if (text_height > required_height) {
        required_height = text_height;
    }

    // the output until now are coordinates to write
    // convert to amount of cols/rows
    required_width++;
    required_height++;

    return std::make_tuple(required_width, required_height);
}